

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall Socket::getBufferSizes(Socket *this,int *sendBuffer,int *receiveBuffer)

{
  undefined4 in_EAX;
  int iVar1;
  int optval;
  socklen_t optlen;
  int local_28;
  socklen_t local_24;
  
  _local_28 = CONCAT44(4,in_EAX);
  iVar1 = getsockopt(this->SocketFileDescriptor,1,7,&local_28,&local_24);
  if (-1 < iVar1) {
    iVar1 = local_28;
  }
  *sendBuffer = iVar1;
  _local_28 = CONCAT44(4,local_28);
  iVar1 = getsockopt(this->SocketFileDescriptor,1,8,&local_28,&local_24);
  if (-1 < iVar1) {
    iVar1 = local_28;
  }
  *receiveBuffer = iVar1;
  return;
}

Assistant:

void Socket::getBufferSizes(int & sendBuffer, int & receiveBuffer) {
  sendBuffer = getSockOpt(SO_SNDBUF);
  receiveBuffer = getSockOpt(SO_RCVBUF);
}